

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_decoder.h
# Opt level: O0

exr_result_t
LossyDctDecoder_base_construct
          (LossyDctDecoder *d,uint8_t *packedAc,uint8_t *packedAcEnd,uint8_t *packedDc,
          uint16_t *toLinear,int width,int height)

{
  int width_local;
  uint16_t *toLinear_local;
  uint8_t *packedDc_local;
  uint8_t *packedAcEnd_local;
  uint8_t *packedAc_local;
  LossyDctDecoder *d_local;
  
  d->_packedAcCount = 0;
  d->_packedDcCount = 0;
  d->_packedAc = packedAc;
  d->_packedAcEnd = packedAcEnd;
  d->_packedDc = packedDc;
  d->_toLinear = toLinear;
  d->_width = width;
  d->_height = height;
  if (d->_toLinear == (uint16_t *)0x0) {
    d->_toLinear = dwaCompressorNoOp;
  }
  d->_channel_decode_data[0] = (DctCoderChannelData *)0x0;
  d->_channel_decode_data[1] = (DctCoderChannelData *)0x0;
  d->_channel_decode_data[2] = (DctCoderChannelData *)0x0;
  d->_channel_decode_data_count = 0;
  return 0;
}

Assistant:

exr_result_t
LossyDctDecoder_base_construct (
    LossyDctDecoder* d,
    uint8_t*         packedAc,
    uint8_t*         packedAcEnd,
    uint8_t*         packedDc,
    const uint16_t*  toLinear,
    int              width,
    int              height)
{
    d->_packedAcCount = 0;
    d->_packedDcCount = 0;
    d->_packedAc      = packedAc;
    d->_packedAcEnd   = packedAcEnd;
    d->_packedDc      = packedDc;
    d->_toLinear      = toLinear;
    d->_width         = width;
    d->_height        = height;
    if (d->_toLinear == NULL) d->_toLinear = dwaCompressorNoOp;

    //d->_isNativeXdr = GLOBAL_SYSTEM_LITTLE_ENDIAN;

    d->_channel_decode_data[0]    = NULL;
    d->_channel_decode_data[1]    = NULL;
    d->_channel_decode_data[2]    = NULL;
    d->_channel_decode_data_count = 0;

    return EXR_ERR_SUCCESS;
}